

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void adjust_assign(LexState *ls,int nvars,int nexps,expdesc *e)

{
  char *pcVar1;
  int iVar2;
  int n;
  
  n = nvars - nexps;
  if (e->k - VCALL < 2) {
    iVar2 = -1;
    if (-1 < n) {
      iVar2 = n;
    }
    luaK_setreturns((FuncState *)ls,e,iVar2 + 1);
    if (0 < n) {
LAB_00111d4f:
      luaK_reserveregs((FuncState *)ls,n);
      return;
    }
  }
  else {
    if (e->k != VVOID) {
      luaK_exp2nextreg((FuncState *)ls,e);
    }
    if (0 < n) {
      luaK_nil((FuncState *)ls,(uint)*(byte *)((long)&ls->z + 4),n);
      goto LAB_00111d4f;
    }
  }
  pcVar1 = (char *)((long)&ls->z + 4);
  *pcVar1 = *pcVar1 + (char)n;
  return;
}

Assistant:

static void adjust_assign (LexState *ls, int nvars, int nexps, expdesc *e) {
  FuncState *fs = ls->fs;
  int needed = nvars - nexps;  /* extra values needed */
  if (hasmultret(e->k)) {  /* last expression has multiple returns? */
    int extra = needed + 1;  /* discount last expression itself */
    if (extra < 0)
      extra = 0;
    luaK_setreturns(fs, e, extra);  /* last exp. provides the difference */
  }
  else {
    if (e->k != VVOID)  /* at least one expression? */
      luaK_exp2nextreg(fs, e);  /* close last expression */
    if (needed > 0)  /* missing values? */
      luaK_nil(fs, fs->freereg, needed);  /* complete with nils */
  }
  if (needed > 0)
    luaK_reserveregs(fs, needed);  /* registers for extra values */
  else  /* adding 'needed' is actually a subtraction */
    fs->freereg += needed;  /* remove extra values */
}